

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

StructDef * __thiscall flatbuffers::Parser::LookupCreateStruct(Parser *this,string *name)

{
  StructDef *this_00;
  
  this_00 = SymbolTable<flatbuffers::StructDef>::Lookup(&this->structs_,name);
  if (this_00 == (StructDef *)0x0) {
    this_00 = (StructDef *)operator_new(0xf0);
    StructDef::StructDef(this_00);
    SymbolTable<flatbuffers::StructDef>::Add(&this->structs_,name,this_00);
    std::__cxx11::string::_M_assign((string *)this_00);
    this_00->predecl = true;
  }
  return this_00;
}

Assistant:

StructDef *Parser::LookupCreateStruct(const std::string &name) {
  auto struct_def = structs_.Lookup(name);
  if (!struct_def) {
    // Rather than failing, we create a "pre declared" StructDef, due to
    // circular references, and check for errors at the end of parsing.
    struct_def = new StructDef();
    structs_.Add(name, struct_def);
    struct_def->name = name;
    struct_def->predecl = true;
  }
  return struct_def;
}